

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  uint uVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  string *psVar7;
  int *retVal_00;
  char *pcVar8;
  string *entry;
  value_type *line;
  _Alloc_hider s;
  string_view str;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  char local_4b9;
  string eline;
  int retVal;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string qrcEntry;
  string qrcContents;
  string rccStdErr;
  string rccStdOut;
  string fileDir;
  string oline;
  istringstream ostr;
  streambuf local_228 [16];
  uint auStack_218 [122];
  
  error->_M_string_length = 0;
  *(error->_M_dataplus)._M_p = '\0';
  psVar7 = error;
  local_490 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  bVar3 = cmsys::SystemTools::FileExists(qrcFile,true);
  if (!bVar3) {
    _ostr = (pointer)0x12;
    text._M_str = (char *)psVar7;
    text._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
    Quoted_abi_cxx11_(&eline,(cmQtAutoGen *)qrcFile->_M_string_length,text);
    oline._M_dataplus._M_p = (pointer)eline._M_string_length;
    oline._M_string_length = (size_type)eline._M_dataplus._M_p;
    cmStrCat<char[17]>(&qrcEntry,(cmAlphaNum *)&ostr,(cmAlphaNum *)&oline,(char (*) [17])0x644811);
    std::__cxx11::string::operator=((string *)error,(string *)&qrcEntry);
    std::__cxx11::string::~string((string *)&qrcEntry);
    std::__cxx11::string::~string((string *)&eline);
    return false;
  }
  cmsys::SystemTools::GetFilenamePath(&fileDir,qrcFile);
  if ((((this->RccExcutable_)._M_string_length == 0) ||
      (bVar3 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar3)) ||
     ((this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    qrcContents._M_dataplus._M_p = (pointer)&qrcContents.field_2;
    qrcContents._M_string_length = 0;
    qrcContents.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&ostr,(qrcFile->_M_dataplus)._M_p,_S_in);
    uVar1 = *(uint *)((long)auStack_218 + *(long *)(_ostr + -0x18));
    if ((uVar1 & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oline);
      std::ostream::operator<<(&oline,local_228);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&qrcContents,(string *)&qrcEntry);
      std::__cxx11::string::~string((string *)&qrcEntry);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oline);
    }
    else {
      oline._M_dataplus._M_p = (pointer)0x12;
      oline._M_string_length = (size_type)anon_var_dwarf_18ab6c9;
      text_00._M_str = (char *)psVar7;
      text_00._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
      Quoted_abi_cxx11_((string *)&cmd,(cmQtAutoGen *)qrcFile->_M_string_length,text_00);
      qrcEntry._M_dataplus._M_p =
           (pointer)cmd.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      qrcEntry._M_string_length =
           (size_type)
           cmd.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      cmStrCat<char[18]>(&eline,(cmAlphaNum *)&oline,(cmAlphaNum *)&qrcEntry,
                         (char (*) [18])" is not readable\n");
      std::__cxx11::string::operator=((string *)error,(string *)&eline);
      std::__cxx11::string::~string((string *)&eline);
      std::__cxx11::string::~string((string *)&cmd);
    }
    std::ifstream::~ifstream(&ostr);
    if ((uVar1 & 5) == 0) {
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&ostr,"(<file[^<]+)");
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&oline,"(^<file[^>]*>)");
      s = qrcContents._M_dataplus;
      while (bVar3 = cmsys::RegularExpression::find((RegularExpression *)&ostr,s._M_p), bVar3) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&qrcEntry,(RegularExpressionMatch *)&ostr,1)
        ;
        s._M_p = s._M_p + qrcEntry._M_string_length;
        cmsys::RegularExpression::find((RegularExpression *)&oline,qrcEntry._M_dataplus._M_p);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&eline,(RegularExpressionMatch *)&oline,1);
        std::__cxx11::string::substr((ulong)&cmd,(ulong)&qrcEntry);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmd);
        std::__cxx11::string::~string((string *)&cmd);
        std::__cxx11::string::~string((string *)&eline);
        std::__cxx11::string::~string((string *)&qrcEntry);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&oline);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&ostr);
      std::__cxx11::string::~string((string *)&qrcContents);
LAB_004356ce:
      pbVar2 = *(pointer *)(local_490 + 8);
      for (psVar7 = *(string **)local_490; psVar7 != pbVar2; psVar7 = psVar7 + 1) {
        cmsys::SystemTools::CollapseFullPath((string *)&ostr,psVar7,&fileDir);
        std::__cxx11::string::operator=((string *)psVar7,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
      }
      bVar3 = true;
      goto LAB_00435718;
    }
    psVar7 = &qrcContents;
LAB_004355d2:
    std::__cxx11::string::~string((string *)psVar7);
  }
  else {
    retVal = 0;
    rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
    rccStdOut._M_string_length = 0;
    rccStdErr._M_dataplus._M_p = (pointer)&rccStdErr.field_2;
    rccStdErr._M_string_length = 0;
    rccStdOut.field_2._M_local_buf[0] = '\0';
    rccStdErr.field_2._M_local_buf[0] = '\0';
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd,
               &this->RccExcutable_);
    ::cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&cmd,&this->ListOptions_);
    cmsys::SystemTools::GetFilenameName((string *)&ostr,qrcFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    if (verbose) {
      _ostr = &DAT_00000011;
      QuotedCommand(&eline,&cmd);
      oline._M_dataplus._M_p = (pointer)eline._M_string_length;
      oline._M_string_length = (size_type)eline._M_dataplus._M_p;
      qrcContents._M_dataplus._M_p._0_1_ = 10;
      cmStrCat<char>(&qrcEntry,(cmAlphaNum *)&ostr,(cmAlphaNum *)&oline,(char *)&qrcContents);
      cmSystemTools::Stdout(&qrcEntry);
      std::__cxx11::string::~string((string *)&qrcEntry);
      std::__cxx11::string::~string((string *)&eline);
    }
    retVal_00 = &retVal;
    bVar3 = cmSystemTools::RunSingleCommand
                      (&cmd,&rccStdOut,&rccStdErr,retVal_00,fileDir._M_dataplus._M_p,OUTPUT_NONE,
                       (cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmd);
    if (!bVar3 || retVal != 0) {
      _ostr = (pointer)0x20;
      text_01._M_str = (char *)retVal_00;
      text_01._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
      Quoted_abi_cxx11_(&eline,(cmQtAutoGen *)qrcFile->_M_string_length,text_01);
      oline._M_dataplus._M_p = (pointer)eline._M_string_length;
      oline._M_string_length = (size_type)eline._M_dataplus._M_p;
      cmd.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(cmd.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      cmStrCat<char>(&qrcEntry,(cmAlphaNum *)&ostr,(cmAlphaNum *)&oline,(char *)&cmd);
      std::__cxx11::string::operator=((string *)error,(string *)&qrcEntry);
      std::__cxx11::string::~string((string *)&qrcEntry);
      std::__cxx11::string::~string((string *)&eline);
      if (rccStdOut._M_string_length != 0) {
        _ostr = (pointer)rccStdOut._M_string_length;
        oline._M_string_length = (size_type)&oline.field_2;
        oline._M_dataplus._M_p = &DAT_00000001;
        oline.field_2._M_local_buf[0] = '\n';
        cmStrCat<>(&qrcEntry,(cmAlphaNum *)&ostr,(cmAlphaNum *)&oline);
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::~string((string *)&qrcEntry);
      }
      if (rccStdErr._M_string_length != 0) {
        _ostr = (pointer)rccStdErr._M_string_length;
        oline._M_string_length = (size_type)&oline.field_2;
        oline._M_dataplus._M_p = &DAT_00000001;
        oline.field_2._M_local_buf[0] = '\n';
        cmStrCat<>(&qrcEntry,(cmAlphaNum *)&ostr,(cmAlphaNum *)&oline);
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::~string((string *)&qrcEntry);
      }
      std::__cxx11::string::~string((string *)&rccStdErr);
      psVar7 = &rccStdOut;
      goto LAB_004355d2;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)&rccStdOut,_S_in);
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    while (line = &oline,
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&ostr,(string *)&oline),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      RccListParseOutput::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&oline,line);
      if (oline._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_490,&oline);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
    std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)&rccStdErr,_S_in);
    eline._M_dataplus._M_p = (pointer)&eline.field_2;
    eline._M_string_length = 0;
    eline.field_2._M_local_buf[0] = '\0';
    while( true ) {
      psVar7 = &eline;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ostr,(string *)&eline);
      pcVar8 = *(char **)(*(long *)piVar5 + -0x18);
      uVar1 = *(uint *)(piVar5 + 0x20 + (long)pcVar8);
      if ((uVar1 & 5) != 0) break;
      RccListParseOutput::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&eline,psVar7);
      str._M_str = eline._M_dataplus._M_p;
      str._M_len = eline._M_string_length;
      bVar3 = cmHasLiteralPrefix<14ul>(str,(char (*) [14])"RCC: Error in");
      if (bVar3) {
        if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar4 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                         ::searchString_abi_cxx11_), iVar4 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                     ::searchString_abi_cxx11_,"Cannot find file \'",(allocator<char> *)&oline);
          __cxa_atexit(std::__cxx11::string::~string,
                       RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                       ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                               ::searchString_abi_cxx11_);
        }
        lVar6 = std::__cxx11::string::find((string *)&eline,0x86ddc0);
        if (lVar6 == -1) {
          oline._M_dataplus._M_p = (pointer)0x1d;
          oline._M_string_length = (size_type)anon_var_dwarf_18ab818;
          text_02._M_str = pcVar8;
          text_02._M_len = (size_t)eline._M_dataplus._M_p;
          Quoted_abi_cxx11_(&qrcContents,(cmQtAutoGen *)eline._M_string_length,text_02);
          qrcEntry._M_dataplus._M_p = (pointer)qrcContents._M_string_length;
          qrcEntry._M_string_length = (size_type)qrcContents._M_dataplus._M_p;
          local_4b9 = '\n';
          cmStrCat<char>((string *)&cmd,(cmAlphaNum *)&oline,(cmAlphaNum *)&qrcEntry,&local_4b9);
          std::__cxx11::string::operator=((string *)error,(string *)&cmd);
          std::__cxx11::string::~string((string *)&cmd);
          std::__cxx11::string::~string((string *)&qrcContents);
          break;
        }
        std::__cxx11::string::substr((ulong)&oline,(ulong)&eline);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_490,&oline);
        std::__cxx11::string::~string((string *)&oline);
      }
    }
    std::__cxx11::string::~string((string *)&eline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
    std::__cxx11::string::~string((string *)&rccStdErr);
    std::__cxx11::string::~string((string *)&rccStdOut);
    if ((uVar1 & 5) != 0) goto LAB_004356ce;
  }
  bVar3 = false;
LAB_00435718:
  std::__cxx11::string::~string((string *)&fileDir);
  return bVar3;
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error =
      cmStrCat("The resource file ", Quoted(qrcFile), " does not exist.");
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cm::append(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Running command:\n", QuotedCommand(cmd), '\n'));
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error =
        cmStrCat("The rcc list process failed for ", Quoted(qrcFile), '\n');
      if (!rccStdOut.empty()) {
        error += cmStrCat(rccStdOut, '\n');
      }
      if (!rccStdErr.empty()) {
        error += cmStrCat(rccStdErr, '\n');
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = cmStrCat("The resource file ", Quoted(qrcFile),
                           " is not readable\n");
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}